

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

void ZSTD_setBasePrices(optState_t *optPtr,int optLevel)

{
  int iVar1;
  uint uVar2;
  U32 UVar3;
  uint uVar4;
  ulong uVar5;
  
  if (optPtr->literalCompressionMode != ZSTD_ps_disable) {
    uVar2 = optPtr->litSum + 1;
    uVar4 = 0x1f;
    if (uVar2 != 0) {
      for (; uVar2 >> uVar4 == 0; uVar4 = uVar4 - 1) {
      }
    }
    if (optLevel == 0) {
      UVar3 = uVar4 << 8;
    }
    else {
      if (0x16 < uVar4) goto LAB_001c9fd4;
      UVar3 = (uVar2 * 0x100 >> ((byte)uVar4 & 0x1f)) + uVar4 * 0x100;
    }
    optPtr->litSumBasePrice = UVar3;
  }
  uVar2 = optPtr->litLengthSum + 1;
  uVar4 = 0x1f;
  if (uVar2 != 0) {
    for (; uVar2 >> uVar4 == 0; uVar4 = uVar4 - 1) {
    }
  }
  if (optLevel != 0) {
    if (uVar4 < 0x17) {
      optPtr->litLengthSumBasePrice = (uVar2 * 0x100 >> ((byte)uVar4 & 0x1f)) + uVar4 * 0x100;
      uVar2 = optPtr->matchLengthSum + 1;
      uVar4 = 0x1f;
      if (uVar2 != 0) {
        for (; uVar2 >> uVar4 == 0; uVar4 = uVar4 - 1) {
        }
      }
      if (uVar4 < 0x17) {
        optPtr->matchLengthSumBasePrice = (uVar2 * 0x100 >> ((byte)uVar4 & 0x1f)) + uVar4 * 0x100;
        uVar2 = optPtr->offCodeSum + 1;
        uVar4 = 0x1f;
        if (uVar2 != 0) {
          for (; uVar2 >> uVar4 == 0; uVar4 = uVar4 - 1) {
          }
        }
        if (uVar4 < 0x17) {
          UVar3 = (uVar2 * 0x100 >> ((byte)uVar4 & 0x1f)) + uVar4 * 0x100;
          goto LAB_001c9fcf;
        }
      }
    }
LAB_001c9fd4:
    __assert_fail("hb + BITCOST_ACCURACY < 31",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x7f60,"U32 ZSTD_fracWeight(U32)");
  }
  uVar2 = optPtr->matchLengthSum + 1;
  iVar1 = 0x1f;
  if (uVar2 != 0) {
    for (; uVar2 >> iVar1 == 0; iVar1 = iVar1 + -1) {
    }
  }
  uVar5 = CONCAT44((int)((CONCAT44(iVar1,uVar4) ^ 0x1f0000001f) >> 0x20) << 8,
                   (int)(CONCAT44(iVar1,uVar4) ^ 0x1f) << 8) ^ (ulong)DAT_002fd590;
  optPtr->litLengthSumBasePrice = (int)uVar5;
  optPtr->matchLengthSumBasePrice = (int)(uVar5 >> 0x20);
  uVar4 = optPtr->offCodeSum + 1;
  iVar1 = 0x1f;
  if (uVar4 != 0) {
    for (; uVar4 >> iVar1 == 0; iVar1 = iVar1 + -1) {
    }
  }
  UVar3 = iVar1 << 8;
LAB_001c9fcf:
  optPtr->offCodeSumBasePrice = UVar3;
  return;
}

Assistant:

static void ZSTD_setBasePrices(optState_t* optPtr, int optLevel)
{
    if (ZSTD_compressedLiterals(optPtr))
        optPtr->litSumBasePrice = WEIGHT(optPtr->litSum, optLevel);
    optPtr->litLengthSumBasePrice = WEIGHT(optPtr->litLengthSum, optLevel);
    optPtr->matchLengthSumBasePrice = WEIGHT(optPtr->matchLengthSum, optLevel);
    optPtr->offCodeSumBasePrice = WEIGHT(optPtr->offCodeSum, optLevel);
}